

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O0

void calling_value_text_multiple_times(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  int iVar1;
  undefined4 uVar2;
  ExprLhs<const_int_&> EVar3;
  undefined8 *in_RDX;
  undefined8 in_RDI;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  size_t i;
  char *str2;
  size_t len2;
  size_t len;
  AssertionHandler catchAssertionHandler_1;
  char *str;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffca8;
  Flags in_stack_fffffffffffffcac;
  AssertionHandler *in_stack_fffffffffffffcb0;
  ExprLhs<const_unsigned_long_&> in_stack_fffffffffffffcb8;
  AssertionHandler *in_stack_fffffffffffffcc0;
  AssertionHandler *this;
  ExprLhs<char_*const_&> in_stack_fffffffffffffcc8;
  size_type in_stack_fffffffffffffcd0;
  ExprLhs<bool> *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffcec;
  AssertionHandler local_2b0;
  char **local_240;
  AssertionHandler local_1f8;
  ulong local_190;
  char *local_188;
  size_t local_180;
  size_t local_178;
  undefined4 local_16c;
  undefined4 local_168;
  int *local_160;
  SourceLineInfo local_118;
  StringRef local_108;
  char *local_b0;
  undefined1 local_91;
  SourceLineInfo local_80;
  StringRef local_70;
  undefined8 *local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_70 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffcb0,
                        CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
             ,0xd9);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8.m_lhs);
  capturedExpression.m_size = in_stack_fffffffffffffcd0;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffcc8.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffcc0,(StringRef *)in_stack_fffffffffffffcb8.m_lhs,
             (SourceLineInfo *)in_stack_fffffffffffffcb0,capturedExpression,
             in_stack_fffffffffffffcac);
  iVar1 = duckdb_shell_sqlite3_value_type(*local_18);
  if (iVar1 != 1) {
    iVar1 = duckdb_shell_sqlite3_value_type(*local_18);
    if (iVar1 != 2) {
      in_stack_fffffffffffffcec = duckdb_shell_sqlite3_value_type(*local_18);
    }
  }
  local_91 = Catch::Decomposer::operator<=
                       ((Decomposer *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                        false);
  uVar4 = CONCAT13(local_91,(int3)in_stack_fffffffffffffce8);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             in_stack_fffffffffffffcd8);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffcb0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffcb0);
  local_b0 = (char *)duckdb_shell_sqlite3_value_text(*local_18);
  local_108 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffcb0,
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
             ,0xdb);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8.m_lhs);
  capturedExpression_00.m_size = in_stack_fffffffffffffcd0;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffffcc8.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffcc0,(StringRef *)in_stack_fffffffffffffcb8.m_lhs,
             (SourceLineInfo *)in_stack_fffffffffffffcb0,capturedExpression_00,
             in_stack_fffffffffffffcac);
  uVar2 = duckdb_shell_sqlite3_value_type(*local_18);
  local_168 = uVar2;
  EVar3 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     (int *)0x22db26);
  local_16c = 3;
  local_160 = EVar3.m_lhs;
  Catch::ExprLhs<int_const&>::operator==
            ((ExprLhs<const_int_&> *)CONCAT44(in_stack_fffffffffffffcec,uVar4),
             (int *)CONCAT44(uVar2,in_stack_fffffffffffffce0));
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffcb0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x22db88);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffcb0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffcb0);
  local_178 = strlen(local_b0);
  for (local_190 = 0; local_190 < 10; local_190 = local_190 + 1) {
    local_188 = (char *)duckdb_shell_sqlite3_value_text(*local_18);
    local_1f8.m_assertionInfo.lineInfo =
         (SourceLineInfo)
         operator____catch_sr
                   ((char *)in_stack_fffffffffffffcb0,
                    CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    this = &local_1f8;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)this,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
               ,0xe2);
    Catch::StringRef::StringRef((StringRef *)this,(char *)in_stack_fffffffffffffcb8.m_lhs);
    capturedExpression_01.m_size = (size_type)EVar3.m_lhs;
    capturedExpression_01.m_start = (char *)in_stack_fffffffffffffcc8.m_lhs;
    Catch::AssertionHandler::AssertionHandler
              (this,(StringRef *)in_stack_fffffffffffffcb8.m_lhs,
               (SourceLineInfo *)in_stack_fffffffffffffcb0,capturedExpression_01,
               in_stack_fffffffffffffcac);
    in_stack_fffffffffffffcc8 =
         Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (char **)0x22dd2a);
    local_240 = in_stack_fffffffffffffcc8.m_lhs;
    Catch::ExprLhs<char*const&>::operator==
              ((ExprLhs<char_*const_&> *)CONCAT44(in_stack_fffffffffffffcec,uVar4),
               (char **)CONCAT44(uVar2,in_stack_fffffffffffffce0));
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffcb0,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
              );
    Catch::BinaryExpr<char_*const_&,_char_*const_&>::~BinaryExpr
              ((BinaryExpr<char_*const_&,_char_*const_&> *)0x22dd81);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffcb0);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffcb0);
    local_180 = strlen(local_188);
    local_2b0.m_assertionInfo.lineInfo =
         (SourceLineInfo)
         operator____catch_sr
                   ((char *)in_stack_fffffffffffffcb0,
                    CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    in_stack_fffffffffffffcb0 = &local_2b0;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)in_stack_fffffffffffffcb0,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
               ,0xe4);
    Catch::StringRef::StringRef((StringRef *)this,(char *)in_stack_fffffffffffffcb8.m_lhs);
    capturedExpression_02.m_size = (size_type)EVar3.m_lhs;
    capturedExpression_02.m_start = (char *)in_stack_fffffffffffffcc8.m_lhs;
    Catch::AssertionHandler::AssertionHandler
              (this,(StringRef *)in_stack_fffffffffffffcb8.m_lhs,
               (SourceLineInfo *)in_stack_fffffffffffffcb0,capturedExpression_02,
               in_stack_fffffffffffffcac);
    in_stack_fffffffffffffcb8 =
         Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (unsigned_long *)0x22deed);
    Catch::ExprLhs<unsigned_long_const&>::operator==
              ((ExprLhs<const_unsigned_long_&> *)CONCAT44(in_stack_fffffffffffffcec,uVar4),
               (unsigned_long *)CONCAT44(uVar2,in_stack_fffffffffffffce0));
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffcb0,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
              );
    Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
              ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x22df35);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffcb0);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffcb0);
  }
  iVar1 = duckdb_shell_sqlite3_value_bytes(*local_18);
  local_178 = (size_t)iVar1;
  duckdb_shell_sqlite3_result_text(local_8,local_b0,iVar1,0);
  return;
}

Assistant:

static void calling_value_text_multiple_times(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE((sqlite3_value_type(argv[0]) == SQLITE_INTEGER || sqlite3_value_type(argv[0]) == SQLITE_FLOAT ||
	         sqlite3_value_type(argv[0]) == SQLITE_TEXT));
	char *str = (char *)sqlite3_value_text(argv[0]);
	REQUIRE(sqlite3_value_type(argv[0]) == SQLITE_TEXT);
	auto len = strlen(str);
	size_t len2;
	char *str2;
	// calling sqlite3_value_text multiple times,  i.e., 10x
	for (size_t i = 0; i < 10; ++i) {
		str2 = (char *)sqlite3_value_text(argv[0]);
		REQUIRE(str == str2);
		len2 = strlen(str2);
		REQUIRE(len == len2);
	}
	len = sqlite3_value_bytes(argv[0]);
	sqlite3_result_text(context, str, len, nullptr);
}